

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MockArgumentHandler.hpp
# Opt level: O3

size_t __thiscall
ut11::detail::MockArgumentHandler<unsigned_long,std::__cxx11::string,std::__cxx11::string>::
CountCalls<unsigned_long,std::__cxx11::string,std::__cxx11::string>
          (MockArgumentHandler<unsigned_long,std::__cxx11::string,std::__cxx11::string> *this,
          unsigned_long expectations,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *expectations_1,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *expectations_2)

{
  MockArgumentHandler<unsigned_long,std::__cxx11::string,std::__cxx11::string> *pMVar1;
  type_conflict tVar2;
  size_t sVar3;
  const_iterator __end0;
  tuple<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  expectationTuple;
  tuple<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_68;
  
  std::_Tuple_impl<1ul,std::__cxx11::string,std::__cxx11::string>::
  _Tuple_impl<std::__cxx11::string&,std::__cxx11::string&,void>
            ((_Tuple_impl<1ul,std::__cxx11::string,std::__cxx11::string> *)&local_68,expectations_1,
             expectations_2);
  sVar3 = 0;
  local_68.
  super__Tuple_impl<0UL,_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  .super__Head_base<0UL,_unsigned_long,_false>._M_head_impl = expectations;
  for (pMVar1 = *(MockArgumentHandler<unsigned_long,std::__cxx11::string,std::__cxx11::string> **)
                 this; pMVar1 != this;
      pMVar1 = *(MockArgumentHandler<unsigned_long,std::__cxx11::string,std::__cxx11::string> **)
                pMVar1) {
    if (local_68.
        super__Tuple_impl<0UL,_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        .super__Head_base<0UL,_unsigned_long,_false>._M_head_impl ==
        *(unsigned_long *)(pMVar1 + 0x50)) {
      tVar2 = std::enable_if<(1)<(3),bool>::type_ut11::detail::MockArgumentHandler<unsigned_long,std
              ::__cxx11::string,std::__cxx11::string>::MatchTuples<1,3,std::tuple<unsigned_long,std
              ::__cxx11::string,std::__cxx11::string>,std::tuple<unsigned_long,std::__cxx11::
              string,std::__cxx11::string>>
                        ((__cxx11 *)this,
                         (tuple<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)(pMVar1 + 0x10),&local_68);
      sVar3 = sVar3 + tVar2;
    }
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68.
         super__Tuple_impl<0UL,_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         .
         super__Tuple_impl<1UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         .
         super__Head_base<1UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
         ._M_head_impl._M_dataplus._M_p !=
      &local_68.
       super__Tuple_impl<0UL,_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
       .
       super__Tuple_impl<1UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
       .
       super__Head_base<1UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
       ._M_head_impl.field_2) {
    operator_delete(local_68.
                    super__Tuple_impl<0UL,_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    .
                    super__Tuple_impl<1UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    .
                    super__Head_base<1UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
                    ._M_head_impl._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68.
         super__Tuple_impl<0UL,_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         .
         super__Tuple_impl<1UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         .
         super__Tuple_impl<2UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         .
         super__Head_base<2UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
         ._M_head_impl._M_dataplus._M_p !=
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)((long)&local_68.
                 super__Tuple_impl<0UL,_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 .
                 super__Tuple_impl<1UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 .
                 super__Tuple_impl<2UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 .
                 super__Head_base<2UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
                 ._M_head_impl + 0x10U)) {
    operator_delete(local_68.
                    super__Tuple_impl<0UL,_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    .
                    super__Tuple_impl<1UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    .
                    super__Tuple_impl<2UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    .
                    super__Head_base<2UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
                    ._M_head_impl._M_dataplus._M_p);
  }
  return sVar3;
}

Assistant:

std::size_t CountCalls(Expectations... expectations) const
			{
				static_assert(sizeof...(Expectations) == sizeof...(ARGS), "Expectations and Arguments must match");

				std::size_t counter = 0;

				std::tuple<Expectations...> expectationTuple(expectations...);
				for(const std::tuple<ARGS...>& actual : m_arguments)
				{
					if ( MatchTuples<0, sizeof...(ARGS)>(actual, expectationTuple) )
						++counter;
				}
				return counter;
			}